

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

void __thiscall
duckdb::Serializer::WriteProperty<duckdb::optional_idx>
          (Serializer *this,field_id_t field_id,char *tag,optional_idx *value)

{
  idx_t iVar1;
  undefined6 in_register_00000032;
  optional_idx local_18;
  
  (*this->_vptr_Serializer[2])(this,CONCAT62(in_register_00000032,field_id));
  local_18 = (optional_idx)value->index;
  if (local_18.index == 0xffffffffffffffff) {
    iVar1 = 0xffffffffffffffff;
  }
  else {
    iVar1 = optional_idx::GetIndex(&local_18);
  }
  (*this->_vptr_Serializer[0x15])(this,iVar1);
  (*this->_vptr_Serializer[3])(this);
  return;
}

Assistant:

void WriteProperty(const field_id_t field_id, const char *tag, const T &value) {
		OnPropertyBegin(field_id, tag);
		WriteValue(value);
		OnPropertyEnd();
	}